

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

void Lpk_NodeRecordImpact(Lpk_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Lpk_Cut_t *pCut;
  Lpk_Man_t *p_local;
  
  p_00 = Vec_VecEntry(p->vVisited,p->pObj->Id);
  Vec_PtrClear(p_00);
  for (local_34 = 0; local_34 < p->nCuts; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < (int)(*(uint *)(p->pCuts + local_34) & 0x3f);
        local_38 = local_38 + 1) {
      pAVar2 = Abc_NtkObj(p->pNtk,p->pCuts[local_34].pLeaves[local_38]);
      if ((*(uint *)&pAVar2->field_0x14 >> 6 & 1) == 0) {
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffbf | 0x40;
        Vec_PtrPush(p_00,(void *)(long)pAVar2->Id);
        iVar1 = Abc_ObjFanoutNum(pAVar2);
        Vec_PtrPush(p_00,(void *)(long)iVar1);
      }
    }
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p_00), local_34 + 1 < iVar1; local_34 = local_34 + 2) {
    pvVar3 = Vec_PtrEntry(p_00,local_34);
    Vec_PtrEntry(p_00,local_34 + 1);
    pAVar2 = Abc_NtkObj(p->pNtk,(int)pvVar3);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffbf;
  }
  return;
}

Assistant:

void Lpk_NodeRecordImpact( Lpk_Man_t * p )
{
    Lpk_Cut_t * pCut;
    Vec_Ptr_t * vNodes = Vec_VecEntry( p->vVisited, p->pObj->Id );
    Abc_Obj_t * pNode, * pNode2;
    int i, k;
    // collect the nodes that impact the given node
    Vec_PtrClear( vNodes );
    for ( i = 0; i < p->nCuts; i++ )
    {
        pCut = p->pCuts + i;
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
        {
            pNode = Abc_NtkObj( p->pNtk, pCut->pLeaves[k] );
            if ( pNode->fMarkC )
                continue;
            pNode->fMarkC = 1;
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)pNode->Id );
            Vec_PtrPush( vNodes, (void *)(ABC_PTRUINT_T)Abc_ObjFanoutNum(pNode) );
        }
    }
    // clear the marks
    Vec_PtrForEachEntryDouble( Abc_Obj_t *, Abc_Obj_t *, vNodes, pNode, pNode2, i )
    {
        pNode = Abc_NtkObj( p->pNtk, (int)(ABC_PTRUINT_T)pNode );
        pNode->fMarkC = 0;
//        i++;
    }
//printf( "%d ", Vec_PtrSize(vNodes) );
}